

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_global_escape(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  ulong uVar2;
  JSValueUnion JVar3;
  void *pvVar4;
  uint c;
  ulong uVar5;
  JSValue v;
  StringBuffer b_s;
  StringBuffer local_50;
  
  v = JS_ToStringInternal(ctx,*argv,0);
  JVar3 = v.u;
  if ((uint)v.tag != 6) {
    local_50.size = *(uint *)((long)JVar3.ptr + 4) & 0x7fffffff;
    local_50.len = 0;
    local_50.is_wide_char = 0;
    local_50.error_status = 0;
    local_50.ctx = ctx;
    local_50.str = js_alloc_string(ctx,local_50.size,0);
    if (local_50.str == (JSString *)0x0) {
      local_50.size = 0;
      local_50.error_status = -1;
    }
    uVar2 = *(ulong *)((long)JVar3.ptr + 4);
    if ((uVar2 & 0x7fffffff) != 0) {
      uVar5 = 0;
      do {
        if ((*(byte *)((long)JVar3.ptr + 7) & 0x80) == 0) {
          c = (uint)*(byte *)((long)JVar3.ptr + uVar5 + 0x10);
        }
        else {
          c = (uint)*(ushort *)((long)JVar3.ptr + uVar5 * 2 + 0x10);
        }
        if (c < 0x100) {
          pvVar4 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789@*_+-./",c,
                          0x45);
          if (pvVar4 == (void *)0x0) goto LAB_00169846;
          string_buffer_putc16(&local_50,c);
        }
        else {
LAB_00169846:
          encodeURI_hex(&local_50,c);
        }
        uVar5 = uVar5 + 1;
      } while (((uint)uVar2 & 0x7fffffff) != uVar5);
    }
    if ((0xfffffff4 < (uint)v.tag) &&
       (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2)) {
      __JS_FreeValueRT(ctx->rt,v);
    }
    v = string_buffer_end(&local_50);
  }
  return v;
}

Assistant:

static JSValue js_global_escape(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int i, len, c;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return str;

    p = JS_VALUE_GET_STRING(str);
    string_buffer_init(ctx, b, p->len);
    for (i = 0, len = p->len; i < len; i++) {
        c = string_get(p, i);
        if (isUnescaped(c)) {
            string_buffer_putc16(b, c);
        } else {
            encodeURI_hex(b, c);
        }
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);
}